

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemNulTerminate(Mem *pMem)

{
  Mem *pMem_local;
  
  if ((pMem->flags & 0x202) == 2) {
    pMem_local._4_4_ = vdbeMemAddTerminator(pMem);
  }
  else {
    pMem_local._4_4_ = 0;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNulTerminate(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  testcase( (pMem->flags & (MEM_Term|MEM_Str))==(MEM_Term|MEM_Str) );
  testcase( (pMem->flags & (MEM_Term|MEM_Str))==0 );
  if( (pMem->flags & (MEM_Term|MEM_Str))!=MEM_Str ){
    return SQLITE_OK;   /* Nothing to do */
  }else{
    return vdbeMemAddTerminator(pMem);
  }
}